

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>,testing::Matcher<ot::commissioner::Error>>,std::tuple<std::vector<unsigned_char,std::allocator<unsigned_char>>const&,ot::commissioner::Error>>
               (tuple<testing::Matcher<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>,_testing::Matcher<ot::commissioner::Error>_>
                *matcher_tuple,
               tuple<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
               *value_tuple)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>,testing::Matcher<ot::commissioner::Error>>,std::tuple<std::vector<unsigned_char,std::allocator<unsigned_char>>const&,ot::commissioner::Error>>
                    (matcher_tuple,value_tuple);
  if (bVar1) {
    bVar1 = MatcherBase<ot::commissioner::Error>::Matches
                      ((MatcherBase<ot::commissioner::Error> *)matcher_tuple,(Error *)value_tuple);
    return bVar1;
  }
  return false;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }